

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

bool __thiscall CLI::App::_process_config_file(App *this,string *config_file,bool throw_error)

{
  char *file;
  element_type *this_00;
  FileError *__return_storage_ptr__;
  string local_78;
  FileError *anon_var_0;
  undefined1 local_40 [8];
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  path_type path_result;
  bool throw_error_local;
  string *config_file_local;
  App *this_local;
  
  values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = throw_error;
  file = (char *)::std::__cxx11::string::c_str();
  values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = detail::check_path(file);
  if (values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ == file) {
    this_00 = std::__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->config_formatter_);
    Config::from_file((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_40,this_00,
                      config_file);
    _parse_config(this,(vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_40);
    this_local._7_1_ = true;
    std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
              ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_40);
  }
  else {
    if ((values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      __return_storage_ptr__ = (FileError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_78,(string *)config_file);
      FileError::Missing(__return_storage_ptr__,&local_78);
      __cxa_throw(__return_storage_ptr__,&FileError::typeinfo,FileError::~FileError);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

CLI11_INLINE bool App::_process_config_file(const std::string &config_file, bool throw_error) {
    auto path_result = detail::check_path(config_file.c_str());
    if(path_result == detail::path_type::file) {
        try {
            std::vector<ConfigItem> values = config_formatter_->from_file(config_file);
            _parse_config(values);
            return true;
        } catch(const FileError &) {
            if(throw_error) {
                throw;
            }
            return false;
        }
    } else if(throw_error) {
        throw FileError::Missing(config_file);
    } else {
        return false;
    }
}